

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderLang.cpp
# Opt level: O3

int ShCompile(ShHandle handle,char **shaderStrings,int numStrings,int *inputLengths,
             EShOptimizationLevel optLevel,TBuiltInResource *resources,int param_7,
             int defaultVersion,bool forwardCompatible,EShMessages messages,char *shaderFileName)

{
  undefined8 *puVar1;
  long lVar2;
  string sourceEntryPointName;
  bool bVar3;
  byte bVar4;
  anon_unknown_dwarf_b4b9b9 *this;
  TPoolAllocator *pTVar5;
  uint uVar6;
  ForbidIncluder includer;
  TIntermediate intermediate;
  undefined4 in_stack_fffffffffffff73c;
  undefined4 in_stack_fffffffffffff74c;
  undefined4 in_stack_fffffffffffff7a4;
  EShOptimizationLevel optLevel_00;
  undefined **local_840;
  _Alloc_hider local_838;
  ulong uStack_830;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_828;
  TIntermediate local_818;
  
  optLevel_00 = (EShOptimizationLevel)resources;
  uVar6 = 0;
  if (handle != (ShHandle)0x0) {
    this = (anon_unknown_dwarf_b4b9b9 *)(**(code **)(*handle + 0x10))();
    if (this != (anon_unknown_dwarf_b4b9b9 *)0x0) {
      pTVar5 = (TPoolAllocator *)(**(code **)(*(long *)this + 0x28))(this);
      glslang::SetThreadPoolAllocator(pTVar5);
      puVar1 = *(undefined8 **)(this + 0x10);
      uVar6 = 0;
      puVar1[1] = 0;
      *(undefined1 *)*puVar1 = 0;
      lVar2 = *(long *)(this + 0x10);
      *(undefined8 *)(lVar2 + 0x38) = 0;
      **(undefined1 **)(lVar2 + 0x30) = 0;
      lVar2 = *(long *)(this + 0x10);
      *(char **)(lVar2 + 0x28) = shaderFileName;
      *(char **)(lVar2 + 0x58) = shaderFileName;
      glslang::TIntermediate::TIntermediate(&local_818,*(EShLanguage *)(this + 0x18),0,ENoProfile);
      local_840 = &PTR_includeSystem_00921fa0;
      local_838._M_p = (pointer)&local_828;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_838,"","");
      sourceEntryPointName.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffff7a4;
      sourceEntryPointName._0_20_ = ZEXT820(uStack_830);
      sourceEntryPointName.field_2._8_8_ = shaderStrings;
      bVar3 = anon_unknown.dwarf_b4b9b9::CompileDeferred
                        (this,(TCompiler *)shaderStrings,(char **)(ulong)(uint)numStrings,
                         (int)inputLengths,(int *)0x0,(char **)0x6cf608,
                         (char *)CONCAT44(in_stack_fffffffffffff73c,optLevel),optLevel_00,
                         (TBuiltInResource *)CONCAT44(in_stack_fffffffffffff74c,defaultVersion),1,
                         EBadProfile,false,(uint)forwardCompatible,SUB41(messages,0),
                         (EShMessages)&local_818,(TIntermediate *)&local_840,
                         (Includer *)local_838._M_p,sourceEntryPointName,
                         (TEnvironment *)inputLengths,SUB41(optLevel_00,0));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_838._M_p != &local_828) {
        operator_delete(local_838._M_p,local_828._M_allocated_capacity + 1);
      }
      if (bVar3) {
        uVar6 = 1;
        if (optLevel != EShOptNoGeneration && (_Base_ptr)local_818.treeRoot != (_Base_ptr)0x0) {
          bVar4 = (**(code **)(*(long *)this + 0x38))
                            (this,local_818.treeRoot,local_818.version,local_818.profile);
          uVar6 = (uint)bVar4;
        }
      }
      glslang::TIntermediate::removeTree(&local_818);
      pTVar5 = glslang::GetThreadPoolAllocator();
      glslang::TPoolAllocator::pop(pTVar5);
      glslang::TIntermediate::~TIntermediate(&local_818);
    }
  }
  return uVar6;
}

Assistant:

int ShCompile(
    const ShHandle handle,
    const char* const shaderStrings[],
    const int numStrings,
    const int* inputLengths,
    const EShOptimizationLevel optLevel,
    const TBuiltInResource* resources,
    int /*debugOptions*/,
    int defaultVersion,        // use 100 for ES environment, 110 for desktop
    bool forwardCompatible,    // give errors for use of deprecated features
    EShMessages messages,       // warnings/errors/AST; things to print out,
    const char *shaderFileName // the filename
    )
{
    // Map the generic handle to the C++ object
    if (handle == nullptr)
        return 0;

    TShHandleBase* base = reinterpret_cast<TShHandleBase*>(handle);
    TCompiler* compiler = base->getAsCompiler();
    if (compiler == nullptr)
        return 0;

    SetThreadPoolAllocator(compiler->getPool());

    compiler->infoSink.info.erase();
    compiler->infoSink.debug.erase();
    compiler->infoSink.info.setShaderFileName(shaderFileName);
    compiler->infoSink.debug.setShaderFileName(shaderFileName);


    TIntermediate intermediate(compiler->getLanguage());
    TShader::ForbidIncluder includer;
    bool success = CompileDeferred(compiler, shaderStrings, numStrings, inputLengths, nullptr,
                                   "", optLevel, resources, defaultVersion, ENoProfile, false, 0,
                                   forwardCompatible, messages, intermediate, includer);

    //
    // Call the machine dependent compiler
    //
    if (success && intermediate.getTreeRoot() && optLevel != EShOptNoGeneration)
        success = compiler->compile(intermediate.getTreeRoot(), intermediate.getVersion(), intermediate.getProfile());

    intermediate.removeTree();

    // Throw away all the temporary memory used by the compilation process.
    // The push was done in the CompileDeferred() call above.
    GetThreadPoolAllocator().pop();

    return success ? 1 : 0;
}